

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Load(TimeZoneInfo *this,ZoneInfoSource *zip)

{
  vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  *this_00;
  undefined8 *puVar1;
  byte bVar2;
  uint_least8_t uVar3;
  pointer pTVar4;
  pointer pTVar5;
  char acVar6 [1];
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint_least8_t *puVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  iterator iVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  bool *pbVar14;
  size_type sVar15;
  pointer pcVar16;
  const_iterator cVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  TransitionType *tt_00;
  long lVar21;
  TransitionType *tt;
  ulong uVar22;
  Transition *pTVar23;
  pointer pTVar24;
  fields fVar25;
  uchar ch;
  Header hdr;
  vector<char,_std::allocator<char>_> tbuf;
  tzhead tzh;
  absolute_lookup local_d8;
  ulong local_b8;
  vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  *local_b0;
  Header local_a8;
  vector<char,_std::allocator<char>_> local_78;
  tzhead local_5c;
  
  iVar8 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_5c,0x2c);
  if (CONCAT44(extraout_var,iVar8) != 0x2c) {
    return false;
  }
  if (local_5c.tzh_magic != (char  [4])0x66695a54) {
    return false;
  }
  bVar7 = anon_unknown_0::Header::Build(&local_a8,&local_5c);
  acVar6[0] = local_5c.tzh_version[0];
  if (!bVar7) {
    return false;
  }
  if (local_5c.tzh_version[0] == '\0') {
    uVar22 = 4;
  }
  else {
    iVar8 = (*zip->_vptr_ZoneInfoSource[3])
                      (zip,local_a8.timecnt * 5 + local_a8.typecnt * 6 + local_a8.charcnt +
                           local_a8.leapcnt * 8 + local_a8.ttisstdcnt + local_a8.ttisutcnt);
    if (iVar8 != 0) {
      return false;
    }
    iVar8 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_5c,0x2c);
    if (CONCAT44(extraout_var_00,iVar8) != 0x2c) {
      return false;
    }
    if (local_5c.tzh_magic != (char  [4])0x66695a54) {
      return false;
    }
    if (local_5c.tzh_version[0] == '\0') {
      return false;
    }
    bVar7 = anon_unknown_0::Header::Build(&local_a8,&local_5c);
    uVar22 = 8;
    if (!bVar7) {
      return false;
    }
  }
  if ((((local_a8.typecnt == 0) || (local_a8.leapcnt != 0)) ||
      (local_a8.ttisstdcnt != 0 && local_a8.ttisstdcnt != local_a8.typecnt)) ||
     (local_a8.ttisutcnt != 0 && local_a8.ttisutcnt != local_a8.typecnt)) {
    return false;
  }
  local_b8 = local_a8.charcnt;
  sVar15 = local_a8.ttisstdcnt + local_a8.typecnt * 6 + local_a8.ttisutcnt +
           (uVar22 | 1) * local_a8.timecnt + local_a8.charcnt;
  std::vector<char,_std::allocator<char>_>::vector(&local_78,sVar15,(allocator_type *)&local_d8);
  iVar8 = (*zip->_vptr_ZoneInfoSource[2])
                    (zip,local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar15);
  pcVar16 = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start;
  if (CONCAT44(extraout_var_01,iVar8) == sVar15) {
    this_00 = &this->transitions_;
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::reserve(this_00,local_a8.timecnt + 2);
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::resize(this_00,local_a8.timecnt);
    if (local_a8.timecnt == 0) {
      bVar11 = 0;
    }
    else {
      pTVar4 = (this_00->
               super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar15 = 0;
      do {
        if (acVar6[0] == '\0') {
          lVar19 = 0;
          uVar12 = 0;
          do {
            uVar20 = uVar12 << 8;
            uVar12 = (byte)pcVar16[lVar19] | uVar20;
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 != 4);
          uVar18 = uVar12 - 0x100000000;
          if (uVar20 >> 0x1f == 0) {
            uVar18 = uVar12;
          }
        }
        else {
          lVar19 = 0;
          uVar18 = 0;
          do {
            uVar18 = uVar18 << 8 | (ulong)(byte)pcVar16[lVar19];
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 != 8);
        }
        pTVar4[sVar15].unix_time = uVar18;
        if ((sVar15 != 0) && ((long)uVar18 <= pTVar4[sVar15 - 1].unix_time)) goto LAB_00388d9c;
        pcVar16 = pcVar16 + uVar22;
        sVar15 = sVar15 + 1;
      } while (sVar15 != local_a8.timecnt);
      puVar9 = &((this_00->
                 super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 )._M_impl.super__Vector_impl_data._M_start)->type_index;
      bVar11 = 0;
      sVar15 = 0;
      do {
        bVar2 = pcVar16[sVar15];
        *puVar9 = bVar2;
        if (local_a8.typecnt <= bVar2) goto LAB_00388d9c;
        bVar11 = bVar11 | bVar2 == 0;
        sVar15 = sVar15 + 1;
        puVar9 = puVar9 + 0x30;
      } while (local_a8.timecnt != sVar15);
      pcVar16 = pcVar16 + sVar15;
    }
    local_b0 = &this->transition_types_;
    std::
    vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
    ::reserve(local_b0,local_a8.typecnt + 2);
    std::
    vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
    ::resize(local_b0,local_a8.typecnt);
    pTVar24 = (local_b0->
              super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      lVar19 = 0;
      uVar13 = 0;
      do {
        uVar13 = (uint)(byte)pcVar16[lVar19] | uVar13 << 8;
        lVar19 = lVar19 + 1;
      } while ((int)lVar19 != 4);
      pTVar24[uVar12].utc_offset = uVar13;
      if (uVar13 - 0x15180 < 0xfffd5d01) goto LAB_00388d9c;
      pTVar24[uVar12].is_dst = pcVar16[4] != '\0';
      bVar2 = pcVar16[5];
      pTVar24[uVar12].abbr_index = bVar2;
      if (local_b8 <= bVar2) goto LAB_00388d9c;
      pcVar16 = pcVar16 + 6;
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_a8.typecnt);
    this->default_transition_type_ = '\0';
    if (!(bool)(~bVar11 & 1) && local_a8.timecnt != 0) {
      if ((pTVar24->is_dst == true) &&
         (bVar11 = ((this_00->
                    super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                    )._M_impl.super__Vector_impl_data._M_start)->type_index, bVar11 != 0)) {
        pbVar14 = &pTVar24->is_dst + (uint)bVar11 * 0x30;
        do {
          if (*pbVar14 != true) goto LAB_00388a68;
          bVar11 = bVar11 - 1;
          pbVar14 = pbVar14 + -0x30;
        } while (bVar11 != 0);
      }
      bVar11 = 0;
LAB_00388a68:
      do {
        if (local_a8.typecnt == bVar11) break;
        if (pTVar24[bVar11].is_dst != true) {
          this->default_transition_type_ = bVar11;
          break;
        }
        bVar11 = bVar11 + 1;
      } while( true );
    }
    std::__cxx11::string::reserve((ulong)&this->abbreviations_);
    std::__cxx11::string::_M_replace
              ((ulong)&this->abbreviations_,0,(char *)(this->abbreviations_)._M_string_length,
               (ulong)pcVar16);
    if (pcVar16 + local_a8.ttisutcnt +
                  local_a8.ttisstdcnt + (uVar22 + 4) * local_a8.leapcnt + local_a8.charcnt !=
        local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      __assert_fail("bp == tbuf.data() + tbuf.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                    ,0x2d9,"bool absl::time_internal::cctz::TimeZoneInfo::Load(ZoneInfoSource *)");
    }
    (this->future_spec_)._M_string_length = 0;
    *(this->future_spec_)._M_dataplus._M_p = '\0';
    if (local_5c.tzh_version[0] == '\0') {
LAB_00388b8f:
      if ((this->version_)._M_string_length == 0) {
        (*zip->_vptr_ZoneInfoSource[4])(&local_d8,zip);
        std::__cxx11::string::operator=((string *)&this->version_,(string *)&local_d8);
        if ((int *)CONCAT71(local_d8.cs.f_.y._1_7_,(byte)local_d8.cs.f_.y) != &local_d8.offset) {
          operator_delete((undefined1 *)CONCAT71(local_d8.cs.f_.y._1_7_,(byte)local_d8.cs.f_.y),
                          local_d8._16_8_ + 1);
        }
      }
      cVar17._M_current =
           (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if ((cVar17._M_current ==
           (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish) || (-1 < (cVar17._M_current)->unix_time)) {
        iVar10 = std::
                 vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ::_M_emplace_aux<>(this_00,cVar17);
        (iVar10._M_current)->unix_time = -0x800000000000000;
        (iVar10._M_current)->type_index = this->default_transition_type_;
      }
      bVar7 = ExtendTransitions(this);
      if (bVar7) {
        cVar17._M_current =
             (this->transitions_).
             super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (cVar17._M_current[-1].unix_time < 0) {
          uVar3 = cVar17._M_current[-1].type_index;
          iVar10 = std::
                   vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ::_M_emplace_aux<>(this_00,cVar17);
          (iVar10._M_current)->unix_time = 0x7fffffff;
          (iVar10._M_current)->type_index = uVar3;
          cVar17._M_current =
               (this->transitions_).
               super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        pTVar23 = (this_00->
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (cVar17._M_current != pTVar23) {
          tt_00 = (TransitionType *)
                  ((long)&((this->transition_types_).
                           super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                           ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
                  (ulong)((uint)this->default_transition_type_ * 0x30));
          lVar21 = 0x10;
          lVar19 = 0;
          do {
            LocalTime(&local_d8,this,*(int_fast64_t *)((long)pTVar23 + lVar21 + -0x10),tt_00);
            fVar25 = detail::step(CONCAT71(local_d8.cs.f_.y._1_7_,(byte)local_d8.cs.f_.y),
                                  local_d8.cs.f_._8_8_,0xffffffffffffffff);
            *(int_least64_t *)((long)&(pTVar23->civil_sec).f_.y + lVar21) = fVar25.y;
            *(ulong *)(&(pTVar23->civil_sec).f_.m + lVar21) = fVar25._8_8_ & 0xffffffffff;
            tt_00 = (TransitionType *)
                    ((long)&((this->transition_types_).
                             super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                             ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
                    (ulong)((uint)*(byte *)((long)pTVar23 + lVar21 + -8) * 0x30));
            LocalTime(&local_d8,this,*(int_fast64_t *)((long)pTVar23 + lVar21 + -0x10),tt_00);
            puVar1 = (undefined8 *)((long)&pTVar23->unix_time + lVar21);
            *puVar1 = CONCAT71(local_d8.cs.f_.y._1_7_,(byte)local_d8.cs.f_.y);
            puVar1[1] = local_d8.cs.f_._8_8_;
            if ((lVar19 != 0) &&
               (bVar7 = detail::operator<((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                           *)((long)&(this_00->
                                                                                                          
                                                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[-1].
                                                  unix_time + lVar21),
                                          (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                           *)((long)&pTVar23->unix_time + lVar21)), !bVar7))
            goto LAB_00388d9c;
            lVar19 = lVar19 + 1;
            pTVar23 = (this->transitions_).
                      super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            cVar17._M_current =
                 (this->transitions_).
                 super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            lVar21 = lVar21 + 0x30;
          } while (lVar19 != ((long)cVar17._M_current - (long)pTVar23 >> 4) * -0x5555555555555555);
        }
        pTVar24 = (this->transition_types_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar5 = (this->transition_types_).
                 super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pTVar24 != pTVar5) {
          do {
            LocalTime(&local_d8,this,0x7fffffffffffffff,pTVar24);
            (pTVar24->civil_max).f_.y = CONCAT71(local_d8.cs.f_.y._1_7_,(byte)local_d8.cs.f_.y);
            (pTVar24->civil_max).f_.m = local_d8.cs.f_.m;
            (pTVar24->civil_max).f_.d = local_d8.cs.f_.d;
            (pTVar24->civil_max).f_.hh = local_d8.cs.f_.hh;
            (pTVar24->civil_max).f_.mm = local_d8.cs.f_.mm;
            (pTVar24->civil_max).f_.ss = local_d8.cs.f_.ss;
            *(undefined3 *)&(pTVar24->civil_max).f_.field_0xd = local_d8.cs.f_._13_3_;
            LocalTime(&local_d8,this,-0x8000000000000000,pTVar24);
            (pTVar24->civil_min).f_.y = CONCAT71(local_d8.cs.f_.y._1_7_,(byte)local_d8.cs.f_.y);
            (pTVar24->civil_min).f_.m = local_d8.cs.f_.m;
            (pTVar24->civil_min).f_.d = local_d8.cs.f_.d;
            (pTVar24->civil_min).f_.hh = local_d8.cs.f_.hh;
            (pTVar24->civil_min).f_.mm = local_d8.cs.f_.mm;
            (pTVar24->civil_min).f_.ss = local_d8.cs.f_.ss;
            *(undefined3 *)&(pTVar24->civil_min).f_.field_0xd = local_d8.cs.f_._13_3_;
            pTVar24 = pTVar24 + 1;
          } while (pTVar24 != pTVar5);
          cVar17._M_current =
               (this->transitions_).
               super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        bVar7 = true;
        if ((this->transitions_).
            super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != cVar17._M_current) {
          std::
          __shrink_to_fit_aux<std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>,_true>
          ::_S_do_it(this_00);
        }
        goto LAB_00388d9e;
      }
    }
    else {
      iVar8 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_d8,1);
      bVar7 = false;
      if ((CONCAT44(extraout_var_02,iVar8) != 1) || ((byte)local_d8.cs.f_.y != 10))
      goto LAB_00388d9e;
      iVar8 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_d8,1);
      uVar13 = 0xffffffff;
      if (CONCAT44(extraout_var_03,iVar8) == 1) {
        uVar13 = (uint)(byte)local_d8.cs.f_.y;
      }
      while (uVar13 != 0xffffffff) {
        if (uVar13 == 10) goto LAB_00388b8f;
        std::__cxx11::string::push_back((char)this + -0x80);
        iVar8 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_d8,1);
        if (CONCAT44(extraout_var_04,iVar8) == 1) {
          uVar13 = (uint)(byte)local_d8.cs.f_.y;
        }
        else {
          uVar13 = 0xffffffff;
        }
      }
    }
  }
LAB_00388d9c:
  bVar7 = false;
LAB_00388d9e:
  if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool TimeZoneInfo::Load(ZoneInfoSource* zip) {
  // Read and validate the header.
  tzhead tzh;
  if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
  if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
    return false;
  Header hdr;
  if (!hdr.Build(tzh)) return false;
  std::size_t time_len = 4;
  if (tzh.tzh_version[0] != '\0') {
    // Skip the 4-byte data.
    if (zip->Skip(hdr.DataLength(time_len)) != 0) return false;
    // Read and validate the header for the 8-byte data.
    if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
    if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
      return false;
    if (tzh.tzh_version[0] == '\0') return false;
    if (!hdr.Build(tzh)) return false;
    time_len = 8;
  }
  if (hdr.typecnt == 0) return false;
  if (hdr.leapcnt != 0) {
    // This code assumes 60-second minutes so we do not want
    // the leap-second encoded zoneinfo. We could reverse the
    // compensation, but the "right" encoding is rarely used
    // so currently we simply reject such data.
    return false;
  }
  if (hdr.ttisstdcnt != 0 && hdr.ttisstdcnt != hdr.typecnt) return false;
  if (hdr.ttisutcnt != 0 && hdr.ttisutcnt != hdr.typecnt) return false;

  // Read the data into a local buffer.
  std::size_t len = hdr.DataLength(time_len);
  std::vector<char> tbuf(len);
  if (zip->Read(tbuf.data(), len) != len) return false;
  const char* bp = tbuf.data();

  // Decode and validate the transitions.
  transitions_.reserve(hdr.timecnt + 2);
  transitions_.resize(hdr.timecnt);
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].unix_time = (time_len == 4) ? Decode32(bp) : Decode64(bp);
    bp += time_len;
    if (i != 0) {
      // Check that the transitions are ordered by time (as zic guarantees).
      if (!Transition::ByUnixTime()(transitions_[i - 1], transitions_[i]))
        return false;  // out of order
    }
  }
  bool seen_type_0 = false;
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].type_index = Decode8(bp++);
    if (transitions_[i].type_index >= hdr.typecnt) return false;
    if (transitions_[i].type_index == 0) seen_type_0 = true;
  }

  // Decode and validate the transition types.
  transition_types_.reserve(hdr.typecnt + 2);
  transition_types_.resize(hdr.typecnt);
  for (std::size_t i = 0; i != hdr.typecnt; ++i) {
    transition_types_[i].utc_offset =
        static_cast<std::int_least32_t>(Decode32(bp));
    if (transition_types_[i].utc_offset >= kSecsPerDay ||
        transition_types_[i].utc_offset <= -kSecsPerDay)
      return false;
    bp += 4;
    transition_types_[i].is_dst = (Decode8(bp++) != 0);
    transition_types_[i].abbr_index = Decode8(bp++);
    if (transition_types_[i].abbr_index >= hdr.charcnt) return false;
  }

  // Determine the before-first-transition type.
  default_transition_type_ = 0;
  if (seen_type_0 && hdr.timecnt != 0) {
    std::uint_fast8_t index = 0;
    if (transition_types_[0].is_dst) {
      index = transitions_[0].type_index;
      while (index != 0 && transition_types_[index].is_dst) --index;
    }
    while (index != hdr.typecnt && transition_types_[index].is_dst) ++index;
    if (index != hdr.typecnt) default_transition_type_ = index;
  }

  // Copy all the abbreviations.
  abbreviations_.reserve(hdr.charcnt + 10);
  abbreviations_.assign(bp, hdr.charcnt);
  bp += hdr.charcnt;

  // Skip the unused portions. We've already dispensed with leap-second
  // encoded zoneinfo. The ttisstd/ttisgmt indicators only apply when
  // interpreting a POSIX spec that does not include start/end rules, and
  // that isn't the case here (see "zic -p").
  bp += (time_len + 4) * hdr.leapcnt;  // leap-time + TAI-UTC
  bp += 1 * hdr.ttisstdcnt;            // UTC/local indicators
  bp += 1 * hdr.ttisutcnt;             // standard/wall indicators
  assert(bp == tbuf.data() + tbuf.size());

  future_spec_.clear();
  if (tzh.tzh_version[0] != '\0') {
    // Snarf up the NL-enclosed future POSIX spec. Note
    // that version '3' files utilize an extended format.
    auto get_char = [](ZoneInfoSource* azip) -> int {
      unsigned char ch;  // all non-EOF results are positive
      return (azip->Read(&ch, 1) == 1) ? ch : EOF;
    };
    if (get_char(zip) != '\n') return false;
    for (int c = get_char(zip); c != '\n'; c = get_char(zip)) {
      if (c == EOF) return false;
      future_spec_.push_back(static_cast<char>(c));
    }
  }

  // We don't check for EOF so that we're forwards compatible.

  // If we did not find version information during the standard loading
  // process (as of tzh_version '3' that is unsupported), then ask the
  // ZoneInfoSource for any out-of-bound version string it may be privy to.
  if (version_.empty()) {
    version_ = zip->Version();
  }

  // Ensure that there is always a transition in the first half of the
  // time line (the second half is handled below) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  if (transitions_.empty() || transitions_.front().unix_time >= 0) {
    Transition& tr(*transitions_.emplace(transitions_.begin()));
    tr.unix_time = -(1LL << 59);  // -18267312070-10-26T17:01:52+00:00
    tr.type_index = default_transition_type_;
  }

  // Extend the transitions using the future specification.
  if (!ExtendTransitions()) return false;

  // Ensure that there is always a transition in the second half of the
  // time line (the first half is handled above) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  const Transition& last(transitions_.back());
  if (last.unix_time < 0) {
    const std::uint_fast8_t type_index = last.type_index;
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = 2147483647;  // 2038-01-19T03:14:07+00:00
    tr.type_index = type_index;
  }

  // Compute the local civil time for each transition and the preceding
  // second. These will be used for reverse conversions in MakeTime().
  const TransitionType* ttp = &transition_types_[default_transition_type_];
  for (std::size_t i = 0; i != transitions_.size(); ++i) {
    Transition& tr(transitions_[i]);
    tr.prev_civil_sec = LocalTime(tr.unix_time, *ttp).cs - 1;
    ttp = &transition_types_[tr.type_index];
    tr.civil_sec = LocalTime(tr.unix_time, *ttp).cs;
    if (i != 0) {
      // Check that the transitions are ordered by civil time. Essentially
      // this means that an offset change cannot cross another such change.
      // No one does this in practice, and we depend on it in MakeTime().
      if (!Transition::ByCivilTime()(transitions_[i - 1], tr))
        return false;  // out of order
    }
  }

  // Compute the maximum/minimum civil times that can be converted to a
  // time_point<seconds> for each of the zone's transition types.
  for (auto& tt : transition_types_) {
    tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
    tt.civil_min = LocalTime(seconds::min().count(), tt).cs;
  }

  transitions_.shrink_to_fit();
  return true;
}